

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int errParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  void *pvVar4;
  char *__format;
  void *ctx;
  int size;
  xmlChar *base;
  xmlParserCtxtPtr local_40;
  char *local_38;
  
  nb_tests = nb_tests + 1;
  local_38 = err;
  if (((uint)options >> 0x1e & 1) == 0) {
    ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt,testStructuredErrorHandler,0);
    doc = (xmlDocPtr)xmlCtxtReadFile(ctxt,filename,0,options);
    if (((uint)options >> 10 & 1) != 0) {
      pvVar4 = (void *)xmlXIncludeNewContext(doc);
      xmlXIncludeSetErrorHandler(pvVar4,testStructuredErrorHandler,0);
      xmlXIncludeSetFlags(pvVar4,options);
      ctx = pvVar4;
      iVar1 = xmlXIncludeProcessNode(pvVar4,doc);
      if (iVar1 < 0) {
        testErrorHandler(ctx,"%s : failed to parse\n",filename);
        xmlFreeDoc(doc);
        doc = (xmlDocPtr)0x0;
      }
      xmlXIncludeFreeContext(pvVar4);
    }
  }
  else {
    ctxt = (xmlParserCtxtPtr)htmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt,testStructuredErrorHandler,0);
    doc = (xmlDocPtr)htmlCtxtReadFile(ctxt,filename,0,options);
  }
  iVar1 = -1;
  if (result != (char *)0x0) {
    base = (xmlChar *)0x0;
    local_40 = ctxt;
    if (doc == (xmlDocPtr)0x0) {
      base = (xmlChar *)xmlStrdup("");
      size = 0;
    }
    else if (((uint)options >> 0x1e & 1) == 0) {
      xmlDocDumpMemory();
    }
    else {
      htmlDocDumpMemory(doc,&base,&size);
    }
    iVar2 = compareFileMem(result,(char *)base,size);
    (*_xmlFree)(base);
    ctxt = local_40;
    if (iVar2 != 0) {
      fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
      iVar2 = iVar1;
      goto LAB_0010890d;
    }
  }
  if (local_38 == (char *)0x0) {
    iVar2 = 0;
    if (((options & 0x10U) == 0) || (iVar2 = 0, testErrorsSize == 0)) goto LAB_0010890d;
    __format = "Validation for %s failed\n";
  }
  else {
    iVar3 = compareFileMem(local_38,testErrors,testErrorsSize);
    iVar2 = 0;
    if (iVar3 == 0) goto LAB_0010890d;
    __format = "Error for %s failed\n";
  }
  fprintf(_stderr,__format,filename);
  iVar2 = iVar1;
LAB_0010890d:
  iVar3 = testParseContent(ctxt,doc,filename);
  if (-1 < iVar3) {
    iVar1 = iVar2;
  }
  xmlFreeDoc(doc);
  xmlFreeParserCtxt(ctxt);
  return iVar1;
}

Assistant:

static int
errParseTest(const char *filename, const char *result, const char *err,
             int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int size, res = 0;
    int ret = 0;

    nb_tests++;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        ctxt = htmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
        doc = htmlCtxtReadFile(ctxt, filename, NULL, options);
    } else
#endif
    {
        ctxt = xmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
	doc = xmlCtxtReadFile(ctxt, filename, NULL, options);
#ifdef LIBXML_XINCLUDE_ENABLED
        if (options & XML_PARSE_XINCLUDE) {
            xmlXIncludeCtxtPtr xinc = NULL;

            xinc = xmlXIncludeNewContext(doc);
            xmlXIncludeSetErrorHandler(xinc, testStructuredErrorHandler, NULL);
            xmlXIncludeSetFlags(xinc, options);
            if (xmlXIncludeProcessNode(xinc, (xmlNodePtr) doc) < 0) {
                testErrorHandler(NULL, "%s : failed to parse\n", filename);
                xmlFreeDoc(doc);
                doc = NULL;
            }
            xmlXIncludeFreeContext(xinc);
        }
#endif
    }
    if (result) {
        xmlChar *base = NULL;

	if (doc == NULL) {
	    base = xmlStrdup(BAD_CAST "");
	    size = 0;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML) {
		htmlDocDumpMemory(doc, &base, &size);
	    } else
#endif
	    xmlDocDumpMemory(doc, &base, &size);
	}
	res = compareFileMem(result, (char *) base, size);
	xmlFree(base);
    }

    if (res != 0) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        ret = -1;
    } else if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    ret = -1;
	}
    } else if (options & XML_PARSE_DTDVALID) {
        if (testErrorsSize != 0) {
	    fprintf(stderr, "Validation for %s failed\n", filename);
            ret = -1;
        }
    }

    if (testParseContent(ctxt, doc, filename) < 0)
	ret = -1;

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);
    return(ret);
}